

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QCommandLineOption *option)

{
  long lVar1;
  bool bVar2;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringList names;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar3;
  QList<QString> *name;
  QCommandLineParser *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCommandLineParser *)0xaaaaaaaaaaaaaaaa;
  name = in_RDI;
  QCommandLineOption::names
            ((QCommandLineOption *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x1782f7);
  bVar3 = false;
  if (!bVar2) {
    QList<QString>::first(in_RDI);
    bVar3 = isSet(this_00,(QString *)name);
  }
  QList<QString>::~QList((QList<QString> *)0x178331);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::isSet(const QCommandLineOption &option) const
{
    // option.names() might be empty if the constructor failed
    const auto names = option.names();
    return !names.isEmpty() && isSet(names.first());
}